

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_function_wrapper.cpp
# Opt level: O2

void __thiscall
cpp_bindgen::anon_unknown_0::wrap_array_descriptor_Test::TestBody(wrap_array_descriptor_Test *this)

{
  enable_if_t<std::is_lvalue_reference<int_(&)[2][3]>::value_&&_std::is_array<remove_reference_t<int_(&)[2][3]>_>::value_&&_std::is_arithmetic<remove_all_extents_t<remove_reference_t<int_(&)[2][3]>_>_>::value,_int_(&)[2][3]>
  paaiVar1;
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  AssertHelper local_80;
  AssertionResult gtest_ar;
  int array [2] [3];
  bindgen_fortran_array_descriptor local_48;
  
  array[0][0] = 1;
  array[0][1] = 2;
  array[0][2] = 3;
  array[1][0] = 4;
  array[1][1] = 5;
  array[1][2] = 6;
  local_48.type = bindgen_fk_Int;
  local_48.rank = 2;
  local_48.dims[0] = 3;
  local_48.dims[1] = 2;
  local_48.is_acc_present = false;
  local_48.data = array;
  paaiVar1 = make_fortran_array_view<int(&)[2][3]>(&local_48);
  local_88.ptr_._0_4_ = (*paaiVar1)[0][0];
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"array[0][0]","get(&descriptor, 0, 0)",array[0],(int *)&local_88)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/tests/unit_tests/test_function_wrapper.cpp"
               ,0x8c,message);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(wrap, array_descriptor) {
            int array[2][3] = {{1, 2, 3}, {4, 5, 6}};
            bindgen_fortran_array_descriptor descriptor;
            descriptor.data = array;
            descriptor.type = bindgen_fk_Int;
            descriptor.rank = 2;
            descriptor.dims[0] = 3;
            descriptor.dims[1] = 2;
            descriptor.is_acc_present = false;

            auto get = wrap<int(int(&)[2][3], size_t, size_t)>(
                [](int(&array)[2][3], size_t i, size_t j) { return array[i][j]; });
            EXPECT_EQ(array[0][0], get(&descriptor, 0, 0));
        }